

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall ViconDataStreamSDK::Core::VClient::GetEyeTrackerCount(VClient *this,uint *o_rCount)

{
  Enum EVar1;
  bool bVar2;
  Enum GetResult;
  scoped_lock Lock;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  GetResult = Success;
  bVar2 = InitGet<unsigned_int>(this,&GetResult,o_rCount);
  EVar1 = GetResult;
  if (bVar2) {
    *o_rCount = (uint)(((long)(this->m_LatestFrame).m_EyeTrackers.
                              super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_LatestFrame).m_EyeTrackers.
                             super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetEyeTrackerCount( unsigned int & o_rCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult, o_rCount ) )
  {
    o_rCount = static_cast<unsigned int>( m_LatestFrame.m_EyeTrackers.size() );
  }
  return GetResult;
}